

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conc_heter_queue.h
# Opt level: O2

reentrant_put_transaction<unsigned_char> * __thiscall
density::
conc_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<256ul>>
::start_reentrant_emplace<unsigned_char,unsigned_char&>
          (reentrant_put_transaction<unsigned_char> *__return_storage_ptr__,
          conc_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<256ul>>
          *this,uchar *i_construction_params)

{
  conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
  *pcVar1;
  reentrant_put_transaction<unsigned_char> local_68;
  reentrant_put_transaction<unsigned_char> local_40;
  
  std::mutex::lock((mutex *)this);
  heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<256ul>>
  ::start_reentrant_emplace<unsigned_char,unsigned_char&>
            ((reentrant_put_transaction<unsigned_char> *)&local_68,
             (heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<256ul>>
              *)(this + 0x28),i_construction_params);
  pcVar1 = local_68.m_queue;
  local_40.m_put_data.m_control_block = (ControlBlock *)local_68.m_put_transaction.m_queue;
  local_40.m_put_data.m_user_storage = local_68.m_put_transaction.m_put_data.m_control_block;
  local_68.m_queue =
       (conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
        *)0x0;
  heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>_>
  ::reentrant_put_transaction<unsigned_char>::~reentrant_put_transaction
            ((reentrant_put_transaction<unsigned_char> *)&local_68);
  local_40.m_queue =
       (heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_> *)
       0x0;
  local_68.m_put_transaction.m_put_data.m_control_block = local_40.m_put_data.m_control_block;
  local_68.m_put_transaction.m_put_data.m_user_storage = local_40.m_put_data.m_user_storage;
  __return_storage_ptr__->m_queue =
       (conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
        *)this;
  (__return_storage_ptr__->m_put_transaction).m_queue =
       (heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_> *)
       pcVar1;
  (__return_storage_ptr__->m_put_transaction).m_put_data.m_control_block =
       local_40.m_put_data.m_control_block;
  (__return_storage_ptr__->m_put_transaction).m_put_data.m_user_storage =
       local_40.m_put_data.m_user_storage;
  local_68.m_queue =
       (conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
        *)0x0;
  local_68.m_put_transaction.m_queue =
       (heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_> *)
       0x0;
  conc_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>_>
  ::reentrant_put_transaction<unsigned_char>::~reentrant_put_transaction(&local_68);
  heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>_>
  ::reentrant_put_transaction<unsigned_char>::~reentrant_put_transaction(&local_40);
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return __return_storage_ptr__;
}

Assistant:

reentrant_put_transaction<ELEMENT_TYPE>
          start_reentrant_emplace(CONSTRUCTION_PARAMS &&... i_construction_params)
        {
            std::lock_guard<std::mutex> lock(m_mutex);
            auto put_transaction = m_queue.template start_reentrant_emplace<ELEMENT_TYPE>(
              std::forward<CONSTRUCTION_PARAMS>(i_construction_params)...);
            return reentrant_put_transaction<ELEMENT_TYPE>(
              PrivateType(), this, std::move(put_transaction));
        }